

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall singleParticleSpectra::output_dNdSV(singleParticleSpectra *this)

{
  char *pcVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  char cVar7;
  undefined8 uVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ofstream output2_1;
  ofstream output2;
  ofstream output2_2;
  ofstream output3;
  ofstream output;
  ostringstream filename3;
  ostringstream filename2_2;
  ostringstream filename2_1;
  ostringstream filename2;
  ostringstream filename;
  double local_11c0;
  double local_11b8;
  double dStack_11b0;
  char *local_11a8;
  char local_1198 [16];
  char *local_1188;
  filebuf local_1180 [8];
  char local_1178 [8];
  uint auStack_1170 [56];
  ios_base aiStack_1090 [264];
  char *local_f88;
  filebuf local_f80 [8];
  char local_f78 [8];
  uint auStack_f70 [56];
  ios_base aiStack_e90 [264];
  char *local_d88;
  filebuf local_d80 [8];
  char local_d78 [8];
  uint auStack_d70 [56];
  ios_base aiStack_c90 [264];
  char *local_b88;
  filebuf local_b80 [8];
  char local_b78 [8];
  uint auStack_b70 [56];
  ios_base aiStack_a90 [264];
  char *local_988;
  filebuf local_980 [8];
  undefined8 uStack_978;
  uint auStack_970 [56];
  ios_base aiStack_890 [264];
  ostringstream local_788 [112];
  ios_base local_718 [264];
  ostringstream local_610 [112];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/check_",7);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_dNdtau.dat",0xb);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_988,local_f88,_S_out);
  if (local_f88 != local_f78) {
    operator_delete(local_f88);
  }
  if (0 < this->N_tau) {
    lVar11 = 0;
    do {
      pdVar3 = this->dNdtau_array;
      this->tau_array[lVar11] = this->tau_array[lVar11] / (pdVar3[lVar11] + 1.0);
      iVar2 = this->total_number_of_events;
      local_11c0 = pdVar3[lVar11] / (double)iVar2;
      pdVar3[lVar11] = local_11c0;
      local_11c0 = local_11c0 / (double)iVar2;
      if (local_11c0 < 0.0) {
        local_11c0 = sqrt(local_11c0);
      }
      else {
        local_11c0 = SQRT(local_11c0);
      }
      if (this->particle_monval == 0x14d) {
        this->dNdtau_array[lVar11] = this->dNdtau_array[lVar11] / this->reconst_branching_ratio;
        local_11c0 = local_11c0 / this->reconst_branching_ratio;
      }
      *(uint *)((long)auStack_970 + *(long *)(local_988 + -0x18)) =
           *(uint *)((long)auStack_970 + *(long *)(local_988 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_978 + *(long *)(local_988 + -0x18)) = 0x12;
      *(undefined8 *)(local_980 + *(long *)(local_988 + -0x18)) = 8;
      poVar9 = std::ostream::_M_insert<double>(this->tau_array[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->dNdtau_array[lVar11] / this->dtau);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(local_11c0 / this->dtau);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->N_tau);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/check_",7);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_dNdx.dat",9);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_f88,local_1188,_S_out);
  if (local_1188 != local_1178) {
    operator_delete(local_1188);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_f88,"# x  dN/dx  y  dN/dy  r  dN/dr",0x1e);
  std::ios::widen((char)(ostream *)&local_f88 + (char)*(undefined8 *)(local_f88 + -0x18));
  std::ostream::put((char)&local_f88);
  std::ostream::flush();
  if (0 < this->N_xpt) {
    lVar11 = 0;
    do {
      pdVar3 = this->dNdx1_array;
      this->xpt_array[lVar11] = this->xpt_array[lVar11] / (pdVar3[lVar11] + 1.0);
      pdVar4 = this->dNdx2_array;
      this->ypt_array[lVar11] = this->ypt_array[lVar11] / (pdVar4[lVar11] + 1.0);
      pdVar5 = this->dNdr_array;
      this->rpt_array[lVar11] = this->rpt_array[lVar11] / (pdVar5[lVar11] + 1.0);
      local_11c0 = (double)this->total_number_of_events;
      pdVar3[lVar11] = pdVar3[lVar11] / local_11c0;
      pdVar4[lVar11] = pdVar4[lVar11] / local_11c0;
      pdVar5[lVar11] = pdVar5[lVar11] / local_11c0;
      local_11c0 = pdVar3[lVar11] / local_11c0;
      if (local_11c0 < 0.0) {
        local_11c0 = sqrt(local_11c0);
      }
      else {
        local_11c0 = SQRT(local_11c0);
      }
      dVar12 = this->dNdx2_array[lVar11] / (double)this->total_number_of_events;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar13 = this->dNdr_array[lVar11] / (double)this->total_number_of_events;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      auVar14._8_8_ = dVar12;
      auVar14._0_8_ = dVar13;
      if (this->particle_monval == 0x14d) {
        this->dNdx1_array[lVar11] = this->dNdx1_array[lVar11] / this->reconst_branching_ratio;
        this->dNdx2_array[lVar11] = this->dNdx2_array[lVar11] / this->reconst_branching_ratio;
        this->dNdr_array[lVar11] = this->dNdr_array[lVar11] / this->reconst_branching_ratio;
        dVar12 = this->reconst_branching_ratio;
        local_11c0 = local_11c0 / dVar12;
        auVar6._8_4_ = SUB84(dVar12,0);
        auVar6._0_8_ = dVar12;
        auVar6._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar14 = divpd(auVar14,auVar6);
      }
      *(uint *)((long)auStack_f70 + *(long *)(local_f88 + -0x18)) =
           *(uint *)((long)auStack_f70 + *(long *)(local_f88 + -0x18)) & 0xfffffefb | 0x100;
      pcVar1 = local_f78 + *(long *)(local_f88 + -0x18);
      pcVar1[0] = '\x12';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      *(undefined8 *)(local_f80 + *(long *)(local_f88 + -0x18)) = 8;
      poVar9 = std::ostream::_M_insert<double>(this->xpt_array[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->dNdx1_array[lVar11] / this->dspatial_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(local_11c0 / this->dspatial_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->ypt_array[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->dNdx2_array[lVar11] / this->dspatial_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      dStack_11b0 = auVar14._8_8_;
      poVar9 = std::ostream::_M_insert<double>(dStack_11b0 / this->dspatial_x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->rpt_array[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->dNdr_array[lVar11] / this->dspatial_r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      local_11b8 = auVar14._0_8_;
      poVar9 = std::ostream::_M_insert<double>(local_11b8 / this->dspatial_r);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->N_xpt);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/check_",7);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_dNdtaudx1.dat",0xe);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_610,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/check_",7);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_dNdtaudx2.dat",0xe);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_1188,local_d88,_S_out);
  if (local_d88 != local_d78) {
    operator_delete(local_d88);
  }
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_d88,local_b88,_S_out);
  if (local_b88 != local_b78) {
    operator_delete(local_b88);
  }
  if (0 < this->N_tau) {
    lVar11 = 0;
    do {
      if (0 < this->N_xpt) {
        lVar10 = 0;
        do {
          pdVar3 = this->dNdtaudx1_array[lVar11];
          iVar2 = this->total_number_of_events;
          pdVar3[lVar10] = pdVar3[lVar10] / (double)iVar2;
          pdVar4 = this->dNdtaudx2_array[lVar11];
          pdVar4[lVar10] = pdVar4[lVar10] / (double)iVar2;
          if (this->particle_monval == 0x14d) {
            pdVar3[lVar10] = pdVar3[lVar10] / this->reconst_branching_ratio;
            pdVar4[lVar10] = pdVar4[lVar10] / this->reconst_branching_ratio;
          }
          *(uint *)((long)auStack_1170 + *(long *)(local_1188 + -0x18)) =
               *(uint *)((long)auStack_1170 + *(long *)(local_1188 + -0x18)) & 0xfffffefb | 0x100;
          pcVar1 = local_1178 + *(long *)(local_1188 + -0x18);
          pcVar1[0] = '\x12';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          *(undefined8 *)(local_1180 + *(long *)(local_1188 + -0x18)) = 8;
          poVar9 = std::ostream::_M_insert<double>((pdVar3[lVar10] / this->dspatial_x) / this->dtau)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
          *(uint *)((long)auStack_d70 + *(long *)(local_d88 + -0x18)) =
               *(uint *)((long)auStack_d70 + *(long *)(local_d88 + -0x18)) & 0xfffffefb | 0x100;
          pcVar1 = local_d78 + *(long *)(local_d88 + -0x18);
          pcVar1[0] = '\x12';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          *(undefined8 *)(local_d80 + *(long *)(local_d88 + -0x18)) = 8;
          poVar9 = std::ostream::_M_insert<double>
                             ((this->dNdtaudx2_array[lVar11][lVar10] / this->dspatial_x) /
                              this->dtau);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
          lVar10 = lVar10 + 1;
        } while (lVar10 < this->N_xpt);
      }
      std::ios::widen((char)*(undefined8 *)(local_1188 + -0x18) + (char)&local_1188);
      std::ostream::put((char)&local_1188);
      std::ostream::flush();
      cVar7 = (char)&local_d88;
      std::ios::widen((char)*(undefined8 *)(local_d88 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->N_tau);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_788);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_788,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/check_",7);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_dNdetas.dat",0xc);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_b88,local_11a8,_S_out);
  if (local_11a8 != local_1198) {
    operator_delete(local_11a8);
  }
  if (0 < this->N_eta_s) {
    lVar11 = 0;
    do {
      pdVar3 = this->dNdetas_array;
      this->eta_s_array[lVar11] = this->eta_s_array[lVar11] / (pdVar3[lVar11] + 1.0);
      iVar2 = this->total_number_of_events;
      local_11c0 = pdVar3[lVar11] / (double)iVar2;
      pdVar3[lVar11] = local_11c0;
      local_11c0 = local_11c0 / (double)iVar2;
      if (local_11c0 < 0.0) {
        local_11c0 = sqrt(local_11c0);
      }
      else {
        local_11c0 = SQRT(local_11c0);
      }
      if (this->particle_monval == 0x14d) {
        this->dNdetas_array[lVar11] = this->dNdetas_array[lVar11] / this->reconst_branching_ratio;
        local_11c0 = local_11c0 / this->reconst_branching_ratio;
      }
      *(uint *)((long)auStack_b70 + *(long *)(local_b88 + -0x18)) =
           *(uint *)((long)auStack_b70 + *(long *)(local_b88 + -0x18)) & 0xfffffefb | 0x100;
      pcVar1 = local_b78 + *(long *)(local_b88 + -0x18);
      pcVar1[0] = '\x12';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      *(undefined8 *)(local_b80 + *(long *)(local_b88 + -0x18)) = 8;
      poVar9 = std::ostream::_M_insert<double>(this->eta_s_array[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(this->dNdetas_array[lVar11] / this->deta_s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
      poVar9 = std::ostream::_M_insert<double>(local_11c0 / this->deta_s);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->N_eta_s);
  }
  std::ofstream::close();
  uVar8 = _log;
  pcVar1 = _VTT;
  local_b88 = _VTT;
  *(undefined8 *)(local_b80 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_b80);
  std::ios_base::~ios_base(aiStack_a90);
  std::__cxx11::ostringstream::~ostringstream(local_788);
  std::ios_base::~ios_base(local_718);
  local_d88 = pcVar1;
  *(undefined8 *)(local_d80 + *(long *)(pcVar1 + -0x18) + -8) = uVar8;
  std::filebuf::~filebuf(local_d80);
  std::ios_base::~ios_base(aiStack_c90);
  local_1188 = pcVar1;
  *(undefined8 *)(local_1180 + *(long *)(pcVar1 + -0x18) + -8) = uVar8;
  std::filebuf::~filebuf(local_1180);
  std::ios_base::~ios_base(aiStack_1090);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::ios_base::~ios_base(local_428);
  local_f88 = pcVar1;
  *(undefined8 *)(local_f80 + *(long *)(pcVar1 + -0x18) + -8) = uVar8;
  std::filebuf::~filebuf(local_f80);
  std::ios_base::~ios_base(aiStack_e90);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  local_988 = pcVar1;
  *(undefined8 *)(local_980 + *(long *)(pcVar1 + -0x18) + -8) = uVar8;
  std::filebuf::~filebuf(local_980);
  std::ios_base::~ios_base(aiStack_890);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_dNdSV() {
    // first dN/dtau
    ostringstream filename;
    filename << path_ << "/check_" << particle_monval << "_dNdtau.dat";
    ofstream output(filename.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        tau_array[i] = tau_array[i] / (dNdtau_array[i] + 1.);
        dNdtau_array[i] = dNdtau_array[i] / total_number_of_events;
        double dNdtau_err = sqrt(dNdtau_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdtau_array[i] = dNdtau_array[i] / reconst_branching_ratio;
            dNdtau_err = dNdtau_err / reconst_branching_ratio;
        }
        output << scientific << setw(18) << setprecision(8) << tau_array[i]
               << "   " << dNdtau_array[i] / dtau << "   " << dNdtau_err / dtau
               << endl;
    }
    output.close();

    // second dN/dx
    ostringstream filename2;
    filename2 << path_ << "/check_" << particle_monval << "_dNdx.dat";
    ofstream output2(filename2.str().c_str());
    output2 << "# x  dN/dx  y  dN/dy  r  dN/dr" << endl;
    for (int i = 0; i < N_xpt; i++) {
        xpt_array[i] = xpt_array[i] / (dNdx1_array[i] + 1.);
        ypt_array[i] = ypt_array[i] / (dNdx2_array[i] + 1.);
        rpt_array[i] = rpt_array[i] / (dNdr_array[i] + 1.);
        dNdx1_array[i] = dNdx1_array[i] / total_number_of_events;
        dNdx2_array[i] = dNdx2_array[i] / total_number_of_events;
        dNdr_array[i] = dNdr_array[i] / total_number_of_events;
        double dNdx1_err = sqrt(dNdx1_array[i] / total_number_of_events);
        double dNdx2_err = sqrt(dNdx2_array[i] / total_number_of_events);
        double dNdr_err = sqrt(dNdr_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdx1_array[i] = dNdx1_array[i] / reconst_branching_ratio;
            dNdx2_array[i] = dNdx2_array[i] / reconst_branching_ratio;
            dNdr_array[i] = dNdr_array[i] / reconst_branching_ratio;
            dNdx1_err = dNdx1_err / reconst_branching_ratio;
            dNdx2_err = dNdx2_err / reconst_branching_ratio;
            dNdr_err = dNdr_err / reconst_branching_ratio;
        }
        output2 << scientific << setw(18) << setprecision(8) << xpt_array[i]
                << "   " << dNdx1_array[i] / dspatial_x << "   "
                << dNdx1_err / dspatial_x << "   " << ypt_array[i] << "   "
                << dNdx2_array[i] / dspatial_x << "   "
                << dNdx2_err / dspatial_x << "   " << rpt_array[i] << "   "
                << dNdr_array[i] / dspatial_r << "   " << dNdr_err / dspatial_r
                << endl;
    }
    output2.close();

    // dN/(dtau dx)
    ostringstream filename2_1, filename2_2;
    filename2_1 << path_ << "/check_" << particle_monval << "_dNdtaudx1.dat";
    filename2_2 << path_ << "/check_" << particle_monval << "_dNdtaudx2.dat";
    ofstream output2_1(filename2_1.str().c_str());
    ofstream output2_2(filename2_2.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        for (int j = 0; j < N_xpt; j++) {
            dNdtaudx1_array[i][j] =
                (dNdtaudx1_array[i][j] / total_number_of_events);
            dNdtaudx2_array[i][j] =
                (dNdtaudx2_array[i][j] / total_number_of_events);
            if (particle_monval == 333) {
                dNdtaudx1_array[i][j] =
                    (dNdtaudx1_array[i][j] / reconst_branching_ratio);
                dNdtaudx2_array[i][j] =
                    (dNdtaudx2_array[i][j] / reconst_branching_ratio);
            }
            output2_1 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx1_array[i][j] / dspatial_x / dtau << "   ";
            output2_2 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx2_array[i][j] / dspatial_x / dtau << "   ";
        }
        output2_1 << endl;
        output2_2 << endl;
    }
    output2_1.close();
    output2_2.close();

    // third dN/detas
    ostringstream filename3;
    filename3 << path_ << "/check_" << particle_monval << "_dNdetas.dat";
    ofstream output3(filename3.str().c_str());
    for (int i = 0; i < N_eta_s; i++) {
        eta_s_array[i] = eta_s_array[i] / (dNdetas_array[i] + 1.);
        dNdetas_array[i] = dNdetas_array[i] / total_number_of_events;
        double dNdetas_err = sqrt(dNdetas_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdetas_array[i] = dNdetas_array[i] / reconst_branching_ratio;
            dNdetas_err = dNdetas_err / reconst_branching_ratio;
        }
        output3 << scientific << setw(18) << setprecision(8) << eta_s_array[i]
                << "   " << dNdetas_array[i] / deta_s << "   "
                << dNdetas_err / deta_s << endl;
    }
    output3.close();
}